

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  unsigned_short c)

{
  ushort uVar1;
  undefined6 in_register_0000000a;
  Glyph *pGVar2;
  float fVar3;
  ImVec2 pos_br;
  ImVec2 pos_tl;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  if ((0x20 < (uint)CONCAT62(in_register_0000000a,c)) ||
     ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0)) {
    if (((int)(uint)c < (this->IndexLookup).Size) &&
       (uVar1 = (this->IndexLookup).Data[c], uVar1 != 0xffff)) {
      pGVar2 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
    else {
      pGVar2 = this->FallbackGlyph;
    }
    if (pGVar2 != (Glyph *)0x0) {
      local_38.x = (float)(int)pos.x + (this->DisplayOffset).x;
      fVar3 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                     ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
      local_38.y = (float)(int)pos.y + (this->DisplayOffset).y;
      local_30.x = pGVar2->X0 * fVar3 + local_38.x;
      local_30.y = pGVar2->Y0 * fVar3 + local_38.y;
      local_38.x = pGVar2->X1 * fVar3 + local_38.x;
      local_38.y = fVar3 * pGVar2->Y1 + local_38.y;
      ImDrawList::PrimReserve(draw_list,6,4);
      local_40.x = pGVar2->U0;
      local_40.y = pGVar2->V0;
      local_48.x = pGVar2->U1;
      local_48.y = pGVar2->V1;
      ImDrawList::PrimRectUV(draw_list,&local_30,&local_38,&local_40,&local_48,col);
    }
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, unsigned short c) const
{
    if (c == ' ' || c == '\t' || c == '\n' || c == '\r') // Match behavior of RenderText(), those 4 codepoints are hard-coded.
        return;
    if (const Glyph* glyph = FindGlyph(c))
    {
        float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
        pos.x = (float)(int)pos.x + DisplayOffset.x;
        pos.y = (float)(int)pos.y + DisplayOffset.y;
        ImVec2 pos_tl(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale);
        ImVec2 pos_br(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale);
        draw_list->PrimReserve(6, 4);
        draw_list->PrimRectUV(pos_tl, pos_br, ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
    }
}